

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_singleton.c
# Opt level: O0

void configuration_singleton_destroy(void)

{
  configuration_singleton pcVar1;
  configuration_singleton singleton;
  
  pcVar1 = configuration_singleton_instance();
  pcVar1->global = (configuration)0x0;
  if (pcVar1->scopes != (set)0x0) {
    set_iterate(pcVar1->scopes,configuration_singleton_destroy_cb_iterate,0);
    set_destroy(pcVar1->scopes);
    pcVar1->scopes = (set)0x0;
  }
  return;
}

Assistant:

void configuration_singleton_destroy(void)
{
	configuration_singleton singleton = configuration_singleton_instance();

	singleton->global = NULL;

	if (singleton->scopes != NULL)
	{
		set_iterate(singleton->scopes, &configuration_singleton_destroy_cb_iterate, NULL);

		set_destroy(singleton->scopes);

		singleton->scopes = NULL;
	}
}